

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printAssign(JSPrinter *this,Ref node)

{
  long lVar1;
  
  lVar1 = cashew::Value::asAssign();
  printChild(this,*(Value **)(lVar1 + 8),node,-1);
  space(this);
  emit(this,'=');
  space(this);
  printChild(this,*(Value **)(lVar1 + 0x18),node,1);
  return;
}

Assistant:

void printAssign(Ref node) {
    auto* assign = node->asAssign();
    printChild(assign->target(), node, -1);
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }